

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

void __thiscall simple_thread_pool::ThreadPoolMgr::loop(ThreadPoolMgr *this)

{
  size_t *psVar1;
  pthread_t __target_thread;
  size_t time_us;
  shared_ptr<simple_thread_pool::ThreadHandle> thread_to_assign;
  uint64_t next_sleep_us;
  shared_ptr<simple_thread_pool::TaskHandle> task_to_run;
  TaskResult local_5c;
  __shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> local_58;
  ulong local_48;
  ThreadPoolMgrBase local_40;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"stp_coord");
  local_48 = this->MAX_SLEEP_US;
  do {
    if (((this->stopSignal)._M_base._M_i & 1U) != 0) {
      return;
    }
    psVar1 = &(this->myOpt).busyWaitingIntervalUs;
    time_us = local_48 - *psVar1;
    if (*psVar1 <= local_48 && time_us != 0) {
      EventAwaiter::wait_us(&this->eaLoop,time_us);
    }
    if (((this->stopSignal)._M_base._M_i & 1U) != 0) {
      return;
    }
    LOCK();
    (this->eaLoop).status._M_i = idle;
    UNLOCK();
    local_48 = this->MAX_SLEEP_US;
    local_58._M_ptr = (ThreadHandle *)0x0;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((this->myOpt).numInitialThreads == 0) {
LAB_00107022:
      (*(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase[4])
                ((ThreadPoolMgr *)&stack0xffffffffffffffc0,this,&local_48);
      if ((TaskHandle *)local_40._vptr_ThreadPoolMgrBase == (TaskHandle *)0x0) {
        if (local_58._M_ptr != (ThreadHandle *)0x0) {
          (*(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase[2])(this,&local_58);
        }
      }
      else if ((this->myOpt).numInitialThreads == 0) {
        local_5c.val = OK;
        TaskHandle::execute((TaskHandle *)local_40._vptr_ThreadPoolMgrBase,&local_5c);
      }
      else {
        ThreadHandle::assign
                  (local_58._M_ptr,
                   (shared_ptr<simple_thread_pool::TaskHandle> *)&stack0xffffffffffffffc0);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    }
    else {
      popThread((ThreadPoolMgr *)&stack0xffffffffffffffc0);
      std::__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_58,
                 (__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      if (local_58._M_ptr != (ThreadHandle *)0x0) goto LAB_00107022;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  } while( true );
}

Assistant:

void loop() {
#ifdef __linux__
        pthread_setname_np(pthread_self(), "stp_coord");
#endif
        uint64_t next_sleep_us = MAX_SLEEP_US;

        while (!stopSignal) {
            if (next_sleep_us > myOpt.busyWaitingIntervalUs) {
                eaLoop.wait_us(next_sleep_us - myOpt.busyWaitingIntervalUs);
            } else {
                // Otherwise: busy waiting.
            }
            if (stopSignal) break;

            eaLoop.reset();
            next_sleep_us = MAX_SLEEP_US;

            std::shared_ptr<ThreadHandle> thread_to_assign = nullptr;

            if (myOpt.numInitialThreads) {
                // Thread pool exists, pick an idle thread.
                thread_to_assign = popThread();
                if (!thread_to_assign) {
                    // All threads are busy, skip.
                    continue;
                }
            }
            // Otherwise (empty thread pool),
            // this loop thread will do execution.

            // Check timer task first (higher priority).
            std::shared_ptr<TaskHandle> task_to_run = getTaskToRun(&next_sleep_us);

            if (!task_to_run) {
                // No task to run, skip.
                if (thread_to_assign) {
                    // Return the thread to idle list.
                    returnThread(thread_to_assign);
                }
                continue;
            }

            if (myOpt.numInitialThreads) {
                // Assign the task to picked thread.
                thread_to_assign->assign(task_to_run);
            } else {
                // Empty thread pool, execute here.
                task_to_run->execute(TaskResult());
            }
        }
    }